

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cc
# Opt level: O2

base_learner * binary_setup(options_i *options,vw *all)

{
  base_learner *l;
  single_learner *base;
  learner<char,_example> *plVar1;
  bool binary;
  option_group_definition new_options;
  bool local_14b;
  allocator local_14a;
  allocator local_149;
  string local_148 [32];
  string local_128;
  string local_108;
  option_group_definition local_e8;
  undefined1 local_b0 [112];
  bool local_40;
  
  local_14b = false;
  std::__cxx11::string::string((string *)&local_108,"Binary loss",(allocator *)local_b0);
  VW::config::option_group_definition::option_group_definition(&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string((string *)&local_128,"binary",&local_149);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_b0,&local_128,&local_14b)
  ;
  local_40 = true;
  std::__cxx11::string::string(local_148,"report loss as binary classification on -1,1",&local_14a);
  std::__cxx11::string::_M_assign((string *)(local_b0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_e8,(typed_option<bool> *)local_b0);
  std::__cxx11::string::~string(local_148);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_b0);
  std::__cxx11::string::~string((string *)&local_128);
  (**options->_vptr_options_i)(options,&local_e8);
  if (local_14b == false) {
    plVar1 = (learner<char,_example> *)0x0;
  }
  else {
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar1 = LEARNER::init_learner<char,example,LEARNER::learner<char,example>>
                       (base,predict_or_learn<true>,predict_or_learn<false>);
  }
  VW::config::option_group_definition::~option_group_definition(&local_e8);
  return (base_learner *)plVar1;
}

Assistant:

LEARNER::base_learner* binary_setup(options_i& options, vw& all)
{
  bool binary = false;
  option_group_definition new_options("Binary loss");
  new_options.add(make_option("binary", binary).keep().help("report loss as binary classification on -1,1"));
  options.add_and_parse(new_options);

  if (!binary)
    return nullptr;

  LEARNER::learner<char, example>& ret =
      LEARNER::init_learner(as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  return make_base(ret);
}